

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDsd.c
# Opt level: O0

Lpk_Fun_t * Lpk_DsdSplit(Lpk_Man_t *pMan,Lpk_Fun_t *p,char *pCofVars,int nCofVars,uint uBoundSet)

{
  int iVar;
  int iVar1;
  uint uVar2;
  uint *pIn;
  Kit_DsdNtk_t *pNtk;
  Lpk_Fun_t *p_00;
  uint *puVar3;
  int nCofs;
  int iVacVar;
  int k;
  int i;
  Kit_DsdNtk_t *pNtkDec;
  Lpk_Fun_t *pNew;
  uint uBoundSet_local;
  int nCofVars_local;
  char *pCofVars_local;
  Lpk_Fun_t *p_local;
  Lpk_Man_t *pMan_local;
  
  puVar3 = pMan->ppTruths[0][0];
  pIn = Lpk_FunTruth(p,0);
  Kit_TruthCopy(puVar3,pIn,*(uint *)&p->field_0x8 >> 7 & 0x1f);
  iVar = Kit_WordFindFirstBit(uBoundSet);
  for (iVacVar = 0; iVacVar < nCofVars; iVacVar = iVacVar + 1) {
    for (nCofs = 0; nCofs < 1 << ((byte)iVacVar & 0x1f); nCofs = nCofs + 1) {
      Kit_TruthCofactor0New
                (pMan->ppTruths[iVacVar + 1][nCofs << 1],pMan->ppTruths[iVacVar][nCofs],
                 *(uint *)&p->field_0x8 >> 7 & 0x1f,(int)pCofVars[iVacVar]);
      Kit_TruthCofactor1New
                (pMan->ppTruths[iVacVar + 1][nCofs * 2 + 1],pMan->ppTruths[iVacVar][nCofs],
                 *(uint *)&p->field_0x8 >> 7 & 0x1f,(int)pCofVars[iVacVar]);
    }
  }
  iVar1 = 1 << ((byte)nCofVars & 0x1f);
  for (nCofs = 0; iVacVar = nCofVars, nCofs < iVar1; nCofs = nCofs + 1) {
    pNtk = Kit_DsdDecomposeExpand
                     (pMan->ppTruths[nCofVars][nCofs],*(uint *)&p->field_0x8 >> 7 & 0x1f);
    Kit_DsdTruthPartialTwo
              (pMan->pDsdMan,pNtk,uBoundSet,iVar,pMan->ppTruths[nCofVars + 1][nCofs],
               pMan->ppTruths[nCofVars + 1][iVar1 + nCofs]);
    Kit_DsdNtkFree(pNtk);
  }
  for (; 0 < iVacVar; iVacVar = iVacVar + -1) {
    for (nCofs = 0; nCofs < 1 << ((byte)iVacVar & 0x1f); nCofs = nCofs + 1) {
      Kit_TruthMuxVar(pMan->ppTruths[iVacVar][nCofs],pMan->ppTruths[iVacVar + 1][nCofs << 1],
                      pMan->ppTruths[iVacVar + 1][nCofs * 2 + 1],*(uint *)&p->field_0x8 >> 7 & 0x1f,
                      (int)pCofVars[iVacVar + -1]);
    }
  }
  p_00 = Lpk_FunDup(p,pMan->ppTruths[1][1]);
  puVar3 = Lpk_FunTruth(p,0);
  Kit_TruthCopy(puVar3,pMan->ppTruths[1][0],*(uint *)&p->field_0x8 >> 7 & 0x1f);
  puVar3 = Lpk_FunTruth(p,0);
  uVar2 = Kit_TruthSupport(puVar3,*(uint *)&p->field_0x8 >> 7 & 0x1f);
  p->uSupp = uVar2;
  p->pFanins[iVar] = (byte)*(undefined4 *)&p_00->field_0x8 & 0x7f;
  iVar1 = Lpk_SuppDelay(p_00->uSupp,p_00->pDelays);
  p->pDelays[iVar] = iVar1;
  *(uint *)&p->field_0x8 = *(uint *)&p->field_0x8 & 0xbfffffff;
  Lpk_FunSuppMinimize(p);
  Lpk_FunSuppMinimize(p_00);
  p_00->nDelayLim = p->pDelays[iVar];
  *(uint *)&p_00->field_0x8 = *(uint *)&p_00->field_0x8 & 0xc000ffff | 0x10000;
  *(uint *)&p->field_0x8 =
       *(uint *)&p->field_0x8 & 0xc000ffff |
       ((*(uint *)&p->field_0x8 >> 0x10 & 0x3fff) - 1 & 0x3fff) << 0x10;
  return p_00;
}

Assistant:

Lpk_Fun_t * Lpk_DsdSplit( Lpk_Man_t * pMan, Lpk_Fun_t * p, char * pCofVars, int nCofVars, unsigned uBoundSet )
{
    Lpk_Fun_t * pNew;
    Kit_DsdNtk_t * pNtkDec;
    int i, k, iVacVar, nCofs;
    // prepare storage
    Kit_TruthCopy( pMan->ppTruths[0][0], Lpk_FunTruth(p, 0), p->nVars );
    // get the vacuous variable
    iVacVar = Kit_WordFindFirstBit( uBoundSet );
    // compute the cofactors
    for ( i = 0; i < nCofVars; i++ )
        for ( k = 0; k < (1<<i); k++ )
        {
            Kit_TruthCofactor0New( pMan->ppTruths[i+1][2*k+0], pMan->ppTruths[i][k], p->nVars, pCofVars[i] );
            Kit_TruthCofactor1New( pMan->ppTruths[i+1][2*k+1], pMan->ppTruths[i][k], p->nVars, pCofVars[i] );
        }
    // decompose each cofactor w.r.t. the bound set
    nCofs = (1<<nCofVars);
    for ( k = 0; k < nCofs; k++ )
    {
        pNtkDec = Kit_DsdDecomposeExpand( pMan->ppTruths[nCofVars][k], p->nVars );
        Kit_DsdTruthPartialTwo( pMan->pDsdMan, pNtkDec, uBoundSet, iVacVar, pMan->ppTruths[nCofVars+1][k], pMan->ppTruths[nCofVars+1][nCofs+k] );
        Kit_DsdNtkFree( pNtkDec );
    }
    // compute the composition/decomposition functions (they will be in pMan->ppTruths[1][0]/pMan->ppTruths[1][1])
    for ( i = nCofVars; i >= 1; i-- )
        for ( k = 0; k < (1<<i); k++ )
            Kit_TruthMuxVar( pMan->ppTruths[i][k], pMan->ppTruths[i+1][2*k+0], pMan->ppTruths[i+1][2*k+1], p->nVars, pCofVars[i-1] );

    // derive the new component (decomposition function)
    pNew = Lpk_FunDup( p, pMan->ppTruths[1][1] );
    // update the old component (composition function)
    Kit_TruthCopy( Lpk_FunTruth(p, 0), pMan->ppTruths[1][0], p->nVars );
    p->uSupp = Kit_TruthSupport( Lpk_FunTruth(p, 0), p->nVars );
    p->pFanins[iVacVar] = pNew->Id;
    p->pDelays[iVacVar] = Lpk_SuppDelay( pNew->uSupp, pNew->pDelays );
    // support minimize both
    p->fSupports = 0;
    Lpk_FunSuppMinimize( p );
    Lpk_FunSuppMinimize( pNew );
    // update delay and area requirements
    pNew->nDelayLim = p->pDelays[iVacVar];
    pNew->nAreaLim = 1;
    p->nAreaLim = p->nAreaLim - 1;
    return pNew;
}